

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qibusproxy.cpp
# Opt level: O1

void QIBusProxy::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QString method;
  QString method_00;
  undefined8 *puVar2;
  QIBusEngineDesc *this;
  long in_FS_OFFSET;
  QDBusPendingCall _r_5;
  QDBusPendingCall _r;
  Data *in_stack_fffffffffffffe08;
  Data *pDVar3;
  char16_t *in_stack_fffffffffffffe10;
  QArrayData *pQVar4;
  qsizetype in_stack_fffffffffffffe18;
  QIBusEngineDesc local_1d8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if ((_id == 3) || (_id == 4)) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
        goto LAB_0011942e;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
    goto LAB_0011942e;
  }
  if (_c == IndexOfMethod) {
    if ((*_a[1] == GlobalEngineChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    goto LAB_0011942e;
  }
  if (_c != InvokeMetaMethod) goto LAB_0011942e;
  switch(_id) {
  case 0:
  case 8:
    local_1d8.super_QIBusSerializable.name.d.ptr = (char16_t *)_a[1];
    local_1d8.super_QIBusSerializable.name.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,(void **)&local_1d8);
    break;
  case 1:
    local_1d8.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    CreateInputContext((QDBusPendingReply<QDBusObjectPath> *)&local_1d8,(QIBusProxy *)_o,
                       (QString *)_a[1]);
    if ((QDBusPendingReply<QDBusObjectPath> *)*_a != (QDBusPendingReply<QDBusObjectPath> *)0x0) {
      QDBusPendingReply<QDBusObjectPath>::operator=
                ((QDBusPendingReply<QDBusObjectPath> *)*_a,
                 (QDBusPendingReply<QDBusObjectPath> *)&local_1d8);
    }
    goto LAB_00119305;
  case 2:
    local_1d8.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    Exit((QDBusPendingReply<> *)&local_1d8,(QIBusProxy *)_o,*_a[1]);
    goto LAB_001192f3;
  case 3:
    local_1d8.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    Ping((QDBusPendingReply<QDBusVariant> *)&local_1d8,(QIBusProxy *)_o,(QDBusVariant *)_a[1]);
    if ((QDBusPendingReply<QDBusVariant> *)*_a != (QDBusPendingReply<QDBusVariant> *)0x0) {
      QDBusPendingReply<QDBusVariant>::operator=
                ((QDBusPendingReply<QDBusVariant> *)*_a,
                 (QDBusPendingReply<QDBusVariant> *)&local_1d8);
    }
    goto LAB_00119305;
  case 4:
    local_1d8.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    RegisterComponent((QDBusPendingReply<> *)&local_1d8,(QIBusProxy *)_o,(QDBusVariant *)_a[1]);
LAB_001192f3:
    if ((QDBusPendingReply<> *)*_a != (QDBusPendingReply<> *)0x0) {
      QDBusPendingReply<>::operator=((QDBusPendingReply<> *)*_a,(QDBusPendingReply<> *)&local_1d8);
    }
LAB_00119305:
    QDBusPendingReplyBase::~QDBusPendingReplyBase((QDBusPendingReplyBase *)&local_1d8);
    break;
  case 5:
    local_1d8.super_QIBusSerializable.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    pQVar4 = *_a[1];
    lVar1 = *(long *)((long)_a[1] + 8);
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    method.d.ptr = (char16_t *)pQVar4;
    method.d.d = in_stack_fffffffffffffe08;
    method.d.size = lVar1;
    GetProperty((QIBusProxy *)&local_1d8,method);
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    puVar2 = (undefined8 *)*_a;
    if (puVar2 != (undefined8 *)0x0) {
      pQVar4 = (QArrayData *)*puVar2;
      *puVar2 = local_1d8.super_QIBusSerializable.name.d.d;
      local_1d8.super_QIBusSerializable.name.d.d = (Data *)pQVar4;
    }
    this = &local_1d8;
    goto LAB_0011938c;
  case 6:
    pDVar3 = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1d8.super_QIBusSerializable.name.d.d = (Data *)0x0;
    local_1d8.super_QIBusSerializable.name.d.ptr = L"GlobalEngine";
    local_1d8.super_QIBusSerializable.name.d.size = 0xc;
    method_00.d.ptr = in_stack_fffffffffffffe10;
    method_00.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    method_00.d.size = in_stack_fffffffffffffe18;
    GetProperty((QIBusProxy *)&stack0xfffffffffffffe08,method_00);
    if (&(local_1d8.super_QIBusSerializable.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.super_QIBusSerializable.name.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1d8.super_QIBusSerializable.name.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.super_QIBusSerializable.name.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate
                  (&(local_1d8.super_QIBusSerializable.name.d.d)->super_QArrayData,2,0x10);
      }
    }
    this = (QIBusEngineDesc *)&stack0xfffffffffffffe08;
    if ((undefined8 *)*_a != (undefined8 *)0x0) {
      *(Data **)*_a = pDVar3;
      this = (QIBusEngineDesc *)&stack0xfffffffffffffe08;
    }
LAB_0011938c:
    QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)this);
    break;
  case 7:
    memset(&local_1d8,0xaa,0x1a8);
    getGlobalEngine(&local_1d8,(QIBusProxy *)_o);
    if ((QIBusEngineDesc *)*_a != (QIBusEngineDesc *)0x0) {
      QIBusEngineDesc::operator=((QIBusEngineDesc *)*_a,&local_1d8);
    }
    QIBusEngineDesc::~QIBusEngineDesc(&local_1d8);
  }
LAB_0011942e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIBusProxy::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QIBusProxy *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->GlobalEngineChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: { QDBusPendingReply<QDBusObjectPath> _r = _t->CreateInputContext((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QDBusObjectPath>*>(_a[0]) = std::move(_r); }  break;
        case 2: { QDBusPendingReply<> _r = _t->Exit((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<QDBusVariant> _r = _t->Ping((*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QDBusVariant>*>(_a[0]) = std::move(_r); }  break;
        case 4: { QDBusPendingReply<> _r = _t->RegisterComponent((*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 5: { QDBusPendingCall _r = _t->GetProperty((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingCall*>(_a[0]) = std::move(_r); }  break;
        case 6: { QDBusPendingCall _r = _t->GlobalEngine();
            if (_a[0]) *reinterpret_cast< QDBusPendingCall*>(_a[0]) = std::move(_r); }  break;
        case 7: { QIBusEngineDesc _r = _t->getGlobalEngine();
            if (_a[0]) *reinterpret_cast< QIBusEngineDesc*>(_a[0]) = std::move(_r); }  break;
        case 8: _t->globalEngineChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QIBusProxy::*)(const QString & )>(_a, &QIBusProxy::GlobalEngineChanged, 0))
            return;
    }
}